

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O3

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::buildTree
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *freq,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *alphabet,uint pos,uint this_node,
          uint *next_free_node)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pbVar4;
  tuple<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  __ptr;
  pointer pvVar5;
  bool bVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  unsigned_short uVar7;
  __uniq_ptr_data<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>,_true,_true>
  this_00;
  pointer puVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  ulong __n;
  size_t sVar12;
  iterator __position;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_01;
  ulong uVar13;
  size_t N;
  ulong uVar14;
  pointer __p;
  reference rVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet0;
  uchar *local_f8;
  uchar *puStack_f0;
  uchar *local_e8;
  uchar *local_d8;
  uchar *puStack_d0;
  uchar *local_c8;
  uint *local_c0;
  ulong local_b8;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_b8 = CONCAT44(in_register_0000000c,pos);
  N = 0;
  local_c8 = (uchar *)0x0;
  local_e8 = (uchar *)0x0;
  local_d8 = (uchar *)0x0;
  puStack_d0 = (uchar *)0x0;
  local_f8 = (uchar *)0x0;
  puStack_f0 = (uchar *)0x0;
  puVar8 = (alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c0 = next_free_node;
  if (puVar2 != puVar8) {
    puVar3 = (freq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    N = 0;
    uVar14 = 0;
    uVar13 = 1;
    do {
      if ((ulong)((long)(freq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
          (ulong)puVar8[uVar14]) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      N = N + puVar3[puVar8[uVar14]];
      bVar6 = uVar13 < (ulong)((long)puVar2 - (long)puVar8);
      uVar14 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  this_00.
  super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                  )operator_new(0x1f0);
  bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::bt_impl
            ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
             this_00.
             super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
             .
             super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
             ._M_head_impl,N,0x100);
  pbVar4 = (this->wavelet_tree).
           super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0;
  __ptr.
  super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
  _M_head_impl = *(_Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                   *)&pbVar4[this_node]._impl._M_t.
                      super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ;
  pbVar4[this_node]._impl._M_t.
  super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
       = this_00.
         super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
         .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
         _M_head_impl;
  local_68 = freq;
  if (__ptr.
      super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
      .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>)0x0) {
    std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>::operator()
              ((default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_> *)
               (pbVar4 + this_node),
               (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
               __ptr.
               super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
               .
               super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
               ._M_head_impl);
  }
  if (local_b0 != (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0) {
    std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>::operator()
              ((default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_> *)
               &local_b0,local_b0);
  }
  puVar8 = (alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    __n = local_b8 & 0xffffffff;
    uVar14 = 0;
    uVar13 = 1;
    do {
      uVar9 = (ulong)puVar8[uVar14];
      pvVar5 = (this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->codes).
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x3333333333333333;
      if (uVar11 < uVar9 || uVar11 - uVar9 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      rVar15 = std::vector<bool,_std::allocator<bool>_>::at(pvVar5 + uVar9,__n);
      puVar8 = (alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar9 = (long)(alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
      uVar11 = uVar14;
      if ((*rVar15._M_p & rVar15._M_mask) == 0) {
        if (uVar9 <= uVar14) goto LAB_00110fea;
        pvVar5 = (this->codes).
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (ulong)puVar8[uVar14];
        uVar9 = ((long)(this->codes).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                -0x3333333333333333;
        if (uVar9 < uVar11 || uVar9 - uVar11 == 0) goto LAB_00110fea;
        if (((ulong)*(uint *)((long)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data + 0x18) - 1) +
            ((long)(((_Bit_iterator *)
                    ((long)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
            *(long *)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data) * 8 == __n) {
          uVar7 = (ushort)puVar8[uVar14] + (ushort)this->sigma;
          puVar10 = (this->child0).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00110d13;
        }
        if (puStack_d0 == local_d8) {
          uVar1 = *local_c0;
          (this->child0).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_start[this_node] = (unsigned_short)uVar1;
          *local_c0 = uVar1 + 1;
        }
        if (puStack_d0 == local_c8) {
          this_01 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8;
          __position._M_current = puStack_d0;
          goto LAB_00110da1;
        }
        *puStack_d0 = puVar8[uVar14];
        puStack_d0 = puStack_d0 + 1;
      }
      else {
        if (uVar9 <= uVar14) {
LAB_00110fea:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11,uVar9);
        }
        pvVar5 = (this->codes).
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (ulong)puVar8[uVar14];
        uVar9 = ((long)(this->codes).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                -0x3333333333333333;
        if (uVar9 < uVar11 || uVar9 - uVar11 == 0) goto LAB_00110fea;
        if (((ulong)*(uint *)((long)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data + 0x18) - 1) +
            ((long)(((_Bit_iterator *)
                    ((long)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
            *(long *)&pvVar5[uVar11].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data) * 8 == __n) {
          uVar7 = (ushort)puVar8[uVar14] + (ushort)this->sigma;
          puVar10 = (this->child1).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
LAB_00110d13:
          puVar10[this_node] = uVar7;
        }
        else {
          if (puStack_f0 == local_f8) {
            uVar1 = *local_c0;
            (this->child1).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start[this_node] = (unsigned_short)uVar1;
            *local_c0 = uVar1 + 1;
          }
          if (puStack_f0 == local_e8) {
            this_01 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8;
            __position._M_current = puStack_f0;
LAB_00110da1:
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>(this_01,__position,puVar8 + uVar14);
          }
          else {
            *puStack_f0 = puVar8[uVar14];
            puStack_f0 = puStack_f0 + 1;
          }
        }
      }
      puVar8 = (alphabet->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      bVar6 = uVar13 < (ulong)((long)(alphabet->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar8);
      uVar14 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  __x = local_68;
  if (puStack_d0 != local_d8) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,local_68);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar14 = (long)puStack_d0 - (long)local_d8;
    if (uVar14 == 0) {
      puVar8 = (pointer)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar14 < 0) {
        std::__throw_bad_alloc();
      }
      puVar8 = (pointer)operator_new(uVar14);
      sVar12 = (long)puStack_d0 - (long)local_d8;
    }
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar8 + uVar14;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar8;
    if (puStack_d0 != local_d8) {
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      memmove(puVar8,local_d8,sVar12);
    }
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8 + sVar12;
    buildTree(this,&local_48,&local_a8,(int)local_b8 + 1,
              (uint)(this->child0).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start[this_node],local_c0);
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (puStack_f0 != local_f8) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,__x);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar14 = (long)puStack_f0 - (long)local_f8;
    if (uVar14 == 0) {
      puVar8 = (pointer)0x0;
      sVar12 = 0;
    }
    else {
      if ((long)uVar14 < 0) {
        std::__throw_bad_alloc();
      }
      puVar8 = (pointer)operator_new(uVar14);
      sVar12 = (long)puStack_f0 - (long)local_f8;
    }
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar8 + uVar14;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar8;
    if (puStack_f0 != local_f8) {
      memmove(puVar8,local_f8,sVar12);
    }
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8 + sVar12;
    buildTree(this,&local_60,&local_88,(int)local_b8 + 1,
              (uint)(this->child1).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start[this_node],local_c0);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_f8 != (uchar *)0x0) {
    operator_delete(local_f8);
  }
  if (local_d8 != (uchar *)0x0) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void buildTree(vector<ulint> freq,vector<symbol> alphabet,uint pos,uint this_node, uint * next_free_node){

		vector<symbol> alphabet0;
		vector<symbol> alphabet1;

		ulint size = 0;//size of the current bitvector

		for(uint i=0;i<alphabet.size();i++){

			size += freq.at(alphabet.at(i));

		}

		wavelet_tree[this_node] = bitvector_type(size);

		for(uint i=0;i<alphabet.size();i++){

			if(codes.at(alphabet.at(i)).at(pos)==0){//left (bit 0)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on left: save character

					child0[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet0.size()==0){//if this is the first symbol seen with bit 0, allocate new tree node
						child0[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet0.push_back(alphabet.at(i));

				}

			}else{//right (bit 1)

				if(codes.at(alphabet.at(i)).size()-1==pos){//leaf on right: save character

					child1[this_node] = sigma+alphabet.at(i);

				}else{

					if(alphabet1.size()==0){//if this is the first symbol seen with bit 1, allocate new tree node
						child1[this_node] = *next_free_node;
						*next_free_node += 1;
					}

					alphabet1.push_back(alphabet.at(i));

				}

			}

		}

		if(alphabet0.size()>0)
			buildTree(freq,alphabet0,pos+1,child0[this_node],next_free_node);

		if(alphabet1.size()>0)
			buildTree(freq,alphabet1,pos+1,child1[this_node],next_free_node);


	}